

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O2

int Sat_ProofReduce(Vec_Set_t *vProof,void *pRoots,int hProofPivot)

{
  int iVar1;
  word *pwVar2;
  satset *__src;
  satset *psVar3;
  uint uVar4;
  long lVar5;
  satset *psVar6;
  word **ppwVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  word *pwVar13;
  word wVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  void *local_58;
  ulong local_40;
  
  Abc_Clock();
  uVar4 = Proof_MarkUsedRec(vProof,(Vec_Int_t *)pRoots);
  local_40 = 8;
  if (6 < uVar4 - 1) {
    local_40 = (ulong)uVar4;
  }
  if ((int)local_40 == 0) {
    local_58 = (void *)0x0;
  }
  else {
    local_58 = malloc((long)(int)local_40 << 3);
  }
  uVar9 = (ulong)vProof->iPage;
  bVar8 = (byte)vProof->nPageSize;
  ppwVar7 = vProof->pPages;
  if ((vProof->iPage << (bVar8 & 0x1f)) + (int)*ppwVar7[uVar9] < 2) {
    __assert_fail("h <= Vec_SetHandCurrent(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                  ,0x117,"void Vec_SetShrinkS(Vec_Set_t *, int)");
  }
  uVar10 = 2L >> (bVar8 & 0x3f);
  vProof->iPageS = (int)uVar10;
  ppwVar7[uVar10][1] = (ulong)(vProof->uPageMask & 2);
  uVar4 = 0;
  for (lVar16 = 0; lVar16 <= (int)uVar9; lVar16 = lVar16 + 1) {
    for (uVar18 = 2; pwVar2 = ppwVar7[lVar16], (int)uVar18 < (int)*pwVar2; uVar18 = uVar17 + uVar18)
    {
      uVar9 = (ulong)uVar18;
      uVar17 = ((uint)pwVar2[uVar9] >> 3) + 3 >> 1;
      if (*(int *)((long)pwVar2 + uVar9 * 8 + 4) != 0) {
        bVar8 = (byte)vProof->nPageSize;
        iVar15 = 1 << (bVar8 & 0x1f);
        if (iVar15 <= (int)uVar17) {
          __assert_fail("nWords < (1 << p->nPageSize)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                        ,0xef,"int Vec_SetAppendS(Vec_Set_t *, int)");
        }
        iVar1 = vProof->iPageS;
        pwVar13 = ppwVar7[iVar1];
        wVar14 = pwVar13[1];
        iVar11 = iVar1;
        if (iVar15 <= (int)(uVar17 + (int)wVar14)) {
          iVar11 = iVar1 + 1;
          vProof->iPageS = iVar11;
          pwVar13 = ppwVar7[(long)iVar1 + 1];
          pwVar13[1] = 2;
          wVar14 = 2;
        }
        pwVar2 = pwVar2 + uVar9;
        pwVar13[1] = uVar17 + wVar14;
        uVar12 = ((iVar11 << (bVar8 & 0x1f)) - uVar17) + (int)(uVar17 + wVar14);
        *(uint *)((long)pwVar2 + 4) = uVar12;
        if ((int)uVar12 < 1) {
          __assert_fail("pNode->Id > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                        ,0x19b,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
        }
        uVar12 = (uint)local_40;
        if (uVar4 == uVar12) {
          uVar9 = (ulong)(uVar12 * 2);
          if ((int)uVar12 < 0x10) {
            uVar9 = 0x10;
          }
          if ((int)uVar12 < (int)uVar9) {
            local_40 = uVar9;
            if (local_58 == (void *)0x0) {
              local_58 = malloc(uVar9 << 3);
            }
            else {
              local_58 = realloc(local_58,uVar9 << 3);
            }
          }
        }
        lVar5 = (long)(int)uVar4;
        uVar4 = uVar4 + 1;
        *(word **)((long)local_58 + lVar5 * 8) = pwVar2;
        for (uVar9 = 0; uVar9 < (uint)*pwVar2 >> 3; uVar9 = uVar9 + 1) {
          uVar12 = *(uint *)((long)pwVar2 + uVar9 * 4 + 8);
          if ((uVar12 & 1) == 0) {
            psVar6 = Proof_NodeRead(vProof,(int)uVar12 >> 2);
            uVar12 = *(uint *)((long)pwVar2 + uVar9 * 4 + 8);
          }
          else {
            psVar6 = (satset *)0x0;
          }
          if ((uVar12 & 1) == 0) {
            if (psVar6->Id < 1) {
              __assert_fail("pFanin->Id > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                            ,0x1a1,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
            }
            *(uint *)((long)pwVar2 + uVar9 * 4 + 8) = (uVar12 & 2) + psVar6->Id * 4;
          }
        }
        ppwVar7 = vProof->pPages;
      }
    }
    uVar9 = (ulong)(uint)vProof->iPage;
  }
  for (lVar16 = 1; lVar16 < *(int *)((long)pRoots + 4); lVar16 = lVar16 + 1) {
    iVar15 = Vec_IntEntry((Vec_Int_t *)pRoots,(int)lVar16);
    psVar6 = Proof_NodeRead(vProof,iVar15);
    if (psVar6 == (satset *)0x0) break;
    if (*(int *)((long)pRoots + 4) <= lVar16) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *(int *)(*(long *)((long)pRoots + 8) + lVar16 * 4) = psVar6->Id;
  }
  if ((0 < hProofPivot) &&
     (hProofPivot <=
      (vProof->iPage << ((byte)vProof->nPageSize & 0x1f)) + (int)*vProof->pPages[vProof->iPage])) {
    psVar6 = Proof_NodeRead(vProof,hProofPivot);
    uVar18 = (vProof->iPageS << ((byte)vProof->nPageSize & 0x1f)) +
             (int)vProof->pPages[vProof->iPageS][1];
    uVar10 = 0;
    uVar9 = 0;
    if (0 < (int)uVar4) {
      uVar9 = (ulong)uVar4;
    }
    while( true ) {
      if (uVar9 == uVar10) {
        vProof->nEntries = uVar4;
        free(local_58);
        ppwVar7 = vProof->pPages;
        bVar8 = (byte)vProof->nPageSize;
        uVar4 = (vProof->iPageS << (bVar8 & 0x1f)) + (int)ppwVar7[vProof->iPageS][1];
        if ((int)uVar4 <= (vProof->iPage << (bVar8 & 0x1f)) + (int)*ppwVar7[vProof->iPage]) {
          iVar15 = (int)uVar4 >> (bVar8 & 0x1f);
          vProof->iPage = iVar15;
          lVar5 = (long)iVar15;
          *ppwVar7[lVar5] = (long)(int)(uVar4 & vProof->uPageMask);
          lVar16 = -1;
          if (-1 < lVar5) {
            lVar16 = lVar5;
          }
          for (lVar5 = 0; lVar16 + 1 != lVar5; lVar5 = lVar5 + 1) {
            *ppwVar7[lVar5] = (long)(int)ppwVar7[lVar5][1];
          }
          return uVar18;
        }
        __assert_fail("h <= Vec_SetHandCurrent(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                      ,0x111,"void Vec_SetShrink(Vec_Set_t *, int)");
      }
      __src = *(satset **)((long)local_58 + uVar10 * 8);
      uVar17 = __src->Id;
      __src->Id = 0;
      if (*(uint *)__src < 8) break;
      memmove(vProof->pPages[(int)uVar17 >> ((byte)vProof->nPageSize & 0x1f)] +
              (int)(vProof->uPageMask & uVar17),__src,
              (ulong)((*(uint *)__src >> 1) + 4 & 0xfffffff8) + 8);
      psVar3 = (satset *)0x0;
      if (__src < psVar6) {
        uVar17 = uVar18;
        psVar3 = psVar6;
      }
      if (psVar6 == (satset *)0x0) {
        uVar17 = uVar18;
        psVar3 = psVar6;
      }
      psVar6 = psVar3;
      uVar18 = uVar17;
      uVar10 = uVar10 + 1;
    }
    __assert_fail("nEnts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                  ,0x3b,"int Proof_NodeWordNum(int)");
  }
  __assert_fail("hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                ,0x1ab,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
}

Assistant:

int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot )
{
//    Vec_Set_t * vProof   = (Vec_Set_t *)&s->Proofs;
//    Vec_Int_t * vRoots   = (Vec_Int_t *)&s->claProofs;
    Vec_Int_t * vRoots   = (Vec_Int_t *)pRoots;
//    Vec_Int_t * vClauses = (Vec_Int_t *)&s->clauses;
    int fVerbose = 0;
    Vec_Ptr_t * vUsed;
    satset * pNode, * pFanin, * pPivot;
    int i, j, k, hTemp, nSize;
    abctime clk = Abc_Clock();
    static abctime TimeTotal = 0;
    int RetValue;
//Sat_ProofCheck0( vProof );

    // collect visited nodes
    nSize = Proof_MarkUsedRec( vProof, vRoots );
    vUsed = Vec_PtrAlloc( nSize );
//Sat_ProofCheck0( vProof );

    // relabel nodes to use smaller space
    Vec_SetShrinkS( vProof, 2 );
    Vec_SetForEachEntry( satset *, vProof, nSize, pNode, i, j )
    {
        nSize = Vec_SetWordNum( 2 + pNode->nEnts );
        if ( pNode->Id == 0 ) 
            continue;
        pNode->Id = Vec_SetAppendS( vProof, 2 + pNode->nEnts );
        assert( pNode->Id > 0 );
        Vec_PtrPush( vUsed, pNode );
        // update fanins
        Proof_NodeForeachFanin( vProof, pNode, pFanin, k )
            if ( (pNode->pEnts[k] & 1) == 0 ) // proof node
            {
                assert( pFanin->Id > 0 );
                pNode->pEnts[k] = (pFanin->Id << 2) | (pNode->pEnts[k] & 2);
            }
//            else // problem clause
//                assert( (int*)pFanin >= Vec_IntArray(vClauses) && (int*)pFanin < Vec_IntArray(vClauses)+Vec_IntSize(vClauses) );
    }
    // update roots
    Proof_ForeachNodeVec1( vRoots, vProof, pNode, i )
        Vec_IntWriteEntry( vRoots, i, pNode->Id );
    // determine new pivot
    assert( hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof) );
    pPivot = Proof_NodeRead( vProof, hProofPivot );
    RetValue = Vec_SetHandCurrentS(vProof);
    // compact the nodes
    Vec_PtrForEachEntry( satset *, vUsed, pNode, i )
    {
        hTemp = pNode->Id; pNode->Id = 0;
        memmove( Vec_SetEntry(vProof, hTemp), pNode, sizeof(word)*Proof_NodeWordNum(pNode->nEnts) );
        if ( pPivot && pPivot <= pNode )
        {
            RetValue = hTemp;
            pPivot = NULL;
        }
    }
    Vec_SetWriteEntryNum( vProof, Vec_PtrSize(vUsed) );
    Vec_PtrFree( vUsed );

    // report the result
    if ( fVerbose )
    {
        printf( "\n" );
        printf( "The proof was reduced from %6.2f MB to %6.2f MB (by %6.2f %%)  ", 
            1.0 * Vec_SetMemory(vProof) / (1<<20), 1.0 * Vec_SetMemoryS(vProof) / (1<<20), 
            100.0 * (Vec_SetMemory(vProof) - Vec_SetMemoryS(vProof)) / Vec_SetMemory(vProof) );
        TimeTotal += Abc_Clock() - clk;
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
    Vec_SetShrink( vProof, Vec_SetHandCurrentS(vProof) );
    Vec_SetShrinkLimits( vProof );
//    Sat_ProofReduceCheck( s );
//Sat_ProofCheck0( vProof );

    return RetValue;
}